

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-getsockname.c
# Opt level: O1

int run_test_pipe_getsockname_blocking(void)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  uv_pipe_t *puVar4;
  code **ppcVar5;
  int64_t eval_b;
  int64_t eval_a;
  code *pcStack_20;
  void *local_18;
  void *local_10;
  
  pcStack_20 = (code *)0x1b277e;
  uVar2 = uv_default_loop();
  pcStack_20 = (code *)0x1b2792;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_20 = (code *)0x1b279c;
  uv_run(uVar2,0);
  local_10 = (void *)0x0;
  pcStack_20 = (code *)0x1b27aa;
  uVar2 = uv_default_loop();
  pcStack_20 = (code *)0x1b27b2;
  iVar1 = uv_loop_close(uVar2);
  local_18 = (void *)(long)iVar1;
  if (local_10 == local_18) {
    pcStack_20 = (code *)0x1b27c8;
    uv_library_shutdown();
    return 0;
  }
  puVar4 = (uv_pipe_t *)&stack0xfffffffffffffff0;
  pcStack_20 = pipe_close_cb;
  run_test_pipe_getsockname_blocking_cold_1();
  bVar3 = puVar4 == &pipe_server || puVar4 == &pipe_client;
  pcStack_20 = (code *)(ulong)bVar3;
  if (pcStack_20 != (code *)0x0) {
    pipe_close_cb_called = pipe_close_cb_called + 1;
    return (int)bVar3;
  }
  ppcVar5 = &pcStack_20;
  pipe_close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(ppcVar5,0);
  return iVar1;
}

Assistant:

TEST_IMPL(pipe_getsockname_blocking) {
#ifdef _WIN32
  HANDLE readh, writeh;
  char buf1[1024], buf2[1024];
  size_t len1, len2;
  int r;

  r = CreatePipe(&readh, &writeh, NULL, 65536);
  ASSERT(r);

  r = uv_pipe_init(uv_default_loop(), &pipe_client, 0);
  ASSERT_OK(r);
  r = uv_pipe_open(&pipe_client, readh);
  ASSERT_OK(r);
  r = uv_read_start((uv_stream_t*) &pipe_client,
                    (uv_alloc_cb) abort,
                    (uv_read_cb) abort);
  ASSERT_OK(r);
  Sleep(100);
  r = uv_read_stop((uv_stream_t*)&pipe_client);
  ASSERT_OK(r);

  len1 = sizeof buf1;
  r = uv_pipe_getsockname(&pipe_client, buf1, &len1);
  ASSERT_OK(r);
  ASSERT_OK(len1);  /* It's an annonymous pipe. */

  r = uv_read_start((uv_stream_t*)&pipe_client,
                    (uv_alloc_cb) abort,
                    (uv_read_cb) abort);
  ASSERT_OK(r);
  Sleep(100);

  len2 = sizeof buf2;
  r = uv_pipe_getsockname(&pipe_client, buf2, &len2);
  ASSERT_OK(r);
  ASSERT_OK(len2);  /* It's an annonymous pipe. */

  r = uv_read_stop((uv_stream_t*)&pipe_client);
  ASSERT_OK(r);

  ASSERT_EQ(len1, len2);
  ASSERT_OK(memcmp(buf1, buf2, len1));

  pipe_close_cb_called = 0;
  uv_close((uv_handle_t*)&pipe_client, pipe_close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, pipe_close_cb_called);

  CloseHandle(writeh);
#endif

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}